

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.cpp
# Opt level: O2

void FileUtils::showInGraphicalShell(QWidget *parent,QString *pathIn)

{
  char cVar1;
  byte bVar2;
  QFileInfo fileInfo;
  QString error;
  QProcess browserProc;
  QString app;
  QString folder;
  QString browserArgs;
  QFileInfo local_b0 [8];
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QProcess local_70 [16];
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_30;
  
  QFileInfo::QFileInfo(local_b0,(QString *)pathIn);
  cVar1 = QFileInfo::isDir();
  if (cVar1 == '\0') {
    QFileInfo::filePath();
  }
  else {
    QFileInfo::absoluteFilePath();
  }
  UnixUtils::fileBrowser((QString *)&local_60,(QSettings *)0x0);
  QProcess::QProcess(local_70,(QObject *)0x0);
  UnixUtils::substituteFileBrowserParameters
            ((QString *)&local_30,(QString *)&local_60,(QString *)&local_48);
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (QString *)0x0;
  local_a8.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_88.size = 0;
  bVar2 = QProcess::startDetached
                    ((QString *)&local_30,(QList *)&local_a8,(QString *)&local_88,(longlong *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  QProcess::readAllStandardError();
  QString::fromLocal8Bit<void>((QString *)&local_a8,(QByteArray *)&local_88);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
  if ((bVar2 & local_a8.size == 0) == 0) {
    showGraphicalShellError(parent,(QString *)&local_60,(QString *)&local_a8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QProcess::~QProcess(local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QFileInfo::~QFileInfo(local_b0);
  return;
}

Assistant:

void FileUtils::showInGraphicalShell(QWidget *parent, const QString &pathIn)
{

    const QFileInfo fileInfo(pathIn);

    // Mac, Windows support folder or file.
    if (HostOsInfo::isWindowsHost()) {
        const FileName explorer = Environment::systemEnvironment().searchInPath(QLatin1String("explorer.exe"));
        if (explorer.isEmpty()) {
            QMessageBox::warning(parent,
                                 QApplication::translate("Core::Internal",
                                                         "Launching Windows Explorer Failed"),
                                 QApplication::translate("Core::Internal",
                                                         "Could not find explorer.exe in path to launch Windows Explorer."));
            return;
        }
        QStringList param;
        if (!fileInfo.isDir())
            param += QLatin1String("/select,");
        param += QDir::toNativeSeparators(fileInfo.canonicalFilePath());
        QProcess::startDetached(explorer.toString(), param);
    } else if (HostOsInfo::isMacHost()) {
        QStringList scriptArgs;
        scriptArgs << QLatin1String("-e")
                   << QString::fromLatin1("tell application \"Finder\" to reveal POSIX file \"%1\"")
                                         .arg(fileInfo.canonicalFilePath());
        QProcess::execute(QLatin1String("/usr/bin/osascript"), scriptArgs);
        scriptArgs.clear();
        scriptArgs << QLatin1String("-e")
                   << QLatin1String("tell application \"Finder\" to activate");
        QProcess::execute(QLatin1String("/usr/bin/osascript"), scriptArgs);
    } else {
        // we cannot select a file here, because no file browser really supports it...
        const QString folder = fileInfo.isDir() ? fileInfo.absoluteFilePath() : fileInfo.filePath();
        const QString app = UnixUtils::fileBrowser(ICore::settings());
        QProcess browserProc;
        const QString browserArgs = UnixUtils::substituteFileBrowserParameters(app, folder);
        bool success = browserProc.startDetached(browserArgs);
        const QString error = QString::fromLocal8Bit(browserProc.readAllStandardError());
        success = success && error.isEmpty();
        if (!success)
            showGraphicalShellError(parent, app, error);
    }
}